

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall
cppcms::application::add
          (application *this,application *app,string *name,string *url,string *regex,int part)

{
  string *__rwflag;
  int iVar1;
  undefined4 in_register_0000008c;
  
  __rwflag = regex;
  iVar1 = part;
  add(this,app);
  url_dispatcher::mount
            ((((this->d).ptr_)->url_disp).ptr_,(char *)regex,(char *)app,(char *)(ulong)(uint)part,
             (ulong)__rwflag,(void *)CONCAT44(in_register_0000008c,iVar1));
  url_mapper::mount((((this->d).ptr_)->url_map).ptr_,(char *)name,(char *)url,(char *)app,
                    (ulong)__rwflag,(void *)CONCAT44(in_register_0000008c,iVar1));
  return;
}

Assistant:

void application::add(application &app,std::string const &name,std::string const &url,std::string const &regex,int part)
{
	add(app);
	dispatcher().mount(regex,app,part);
	mapper().mount(name,url,app);
}